

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall
DerBase::Decode<std::__cxx11::wstring>
          (DerBase *this,uchar *pIn,size_t cbIn,DerType type,size_t *cbUsed,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  bool bVar1;
  size_t sVar2;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_60;
  const_iterator local_58;
  size_t local_50;
  size_t cbPrefix;
  size_t size;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value_local;
  size_t *cbUsed_local;
  size_t sStack_28;
  DerType type_local;
  size_t cbIn_local;
  uchar *pIn_local;
  DerBase *this_local;
  
  cbPrefix = 0;
  local_50 = 0;
  size = (size_t)value;
  value_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)cbUsed
  ;
  cbUsed_local._4_4_ = type;
  sStack_28 = cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)this;
  std::__cxx11::wstring::clear();
  bVar1 = CheckDecode((uchar *)cbIn_local,sStack_28,cbUsed_local._4_4_,&cbPrefix,&local_50);
  sVar2 = size;
  if (bVar1) {
    *(size_t *)value_local = local_50 + cbPrefix;
    local_60._M_current = (wchar_t *)std::__cxx11::wstring::begin();
    __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::__normal_iterator<wchar_t*>
              ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_58,&local_60);
    std::__cxx11::wstring::insert<unsigned_char_const*,void>
              ((wstring *)sVar2,local_58,(uchar *)(cbIn_local + local_50),
               (uchar *)(cbIn_local + *(long *)value_local));
    sVar2 = std::__cxx11::wstring::size();
    this->cbData = sVar2;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = DecodeNull((uchar *)cbIn_local,sStack_28,(size_t *)value_local);
  }
  return this_local._7_1_;
}

Assistant:

bool Decode(const unsigned char* pIn, size_t cbIn, const DerType type, size_t& cbUsed, T& value)
	{
		size_t size = 0;
		size_t cbPrefix = 0;

		value.clear();

		if (!CheckDecode(pIn, cbIn, type, size, cbPrefix))
		{
			// Allow Null, will correctly set cbUsed
			return DecodeNull(pIn, cbIn, cbUsed);
		}

		cbUsed = cbPrefix + static_cast<size_t>(size);
		value.insert(value.begin(), pIn + cbPrefix, pIn + cbUsed);
		cbData = value.size();
		return true;
	}